

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.h
# Opt level: O0

void __thiscall
slang::ast::SubroutineSymbol::SubroutineSymbol
          (SubroutineSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          VariableLifetime defaultLifetime,SubroutineKind subroutineKind)

{
  string_view name_00;
  char *in_RCX;
  size_t in_RDX;
  Compilation *in_RDI;
  SourceLocation in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  Symbol *in_stack_ffffffffffffffa0;
  Symbol *parent;
  undefined4 in_stack_ffffffffffffffb0;
  bitmask<slang::ast::DeclaredTypeFlags> in_stack_ffffffffffffffb4;
  
  name_00._M_str = in_RCX;
  name_00._M_len = in_RDX;
  Symbol::Symbol((Symbol *)in_RDI,Subroutine,name_00,in_R8);
  Scope::Scope((Scope *)CONCAT44(in_stack_ffffffffffffffb4.m_bits,in_stack_ffffffffffffffb0),in_RDI,
               in_stack_ffffffffffffffa0);
  parent = (Symbol *)
           &(in_RDI->options).topModules.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .size_ctrl;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask
            ((bitmask<slang::ast::DeclaredTypeFlags> *)&stack0xffffffffffffffb4,None);
  DeclaredType::DeclaredType((DeclaredType *)in_RDI,parent,in_stack_ffffffffffffffb4);
  *(undefined4 *)&(in_RDI->symbolMapAllocator).super_BumpAllocator.head = in_R9D;
  *(undefined4 *)((long)&(in_RDI->symbolMapAllocator).super_BumpAllocator.head + 4) =
       in_stack_00000008;
  *(undefined4 *)&(in_RDI->symbolMapAllocator).super_BumpAllocator.endPtr = 0;
  bitmask<slang::ast::MethodFlags>::bitmask
            ((bitmask<slang::ast::MethodFlags> *)
             ((long)&(in_RDI->symbolMapAllocator).super_BumpAllocator.endPtr + 4),None);
  *(undefined4 *)&(in_RDI->pointerMapAllocator).super_BumpAllocator.head = 0;
  (in_RDI->pointerMapAllocator).super_BumpAllocator.endPtr = (byte *)0x0;
  (in_RDI->constantAllocator).super_BumpAllocator.head = (Segment *)0x0;
  std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *)0x7ec07c
            );
  (in_RDI->driverMapAllocator).freeList = (FreeNode *)0x0;
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)0x7ec098
            );
  in_RDI->scalarTypeTable[0] = (Type *)0x0;
  in_RDI->scalarTypeTable[1] = (Type *)0x0;
  std::optional<bool>::optional((optional<bool> *)0x7ec0bf);
  *(undefined1 *)((long)in_RDI->scalarTypeTable + 0x12) = 0;
  return;
}

Assistant:

SubroutineSymbol(Compilation& compilation, std::string_view name, SourceLocation loc,
                     VariableLifetime defaultLifetime, SubroutineKind subroutineKind) :
        Symbol(SymbolKind::Subroutine, name, loc), Scope(compilation, this),
        declaredReturnType(*this), defaultLifetime(defaultLifetime),
        subroutineKind(subroutineKind) {}